

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O3

void StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command *commands,size_t n_commands,
               uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,uint16_t *cmd_bits,
               uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  
  if (n_commands != 0) {
    uVar14 = *storage_ix;
    sVar15 = 0;
    do {
      uVar9 = commands[sVar15].insert_len_;
      uVar10 = (ulong)uVar9;
      uVar4 = commands[sVar15].copy_len_;
      uVar2 = commands[sVar15].cmd_prefix_;
      bVar1 = cmd_depth[uVar2];
      uVar5 = commands[sVar15].dist_extra_;
      uVar3 = commands[sVar15].dist_prefix_;
      *(ulong *)(storage + (uVar14 >> 3)) =
           (ulong)cmd_bits[uVar2] << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
      uVar14 = bVar1 + uVar14;
      *storage_ix = uVar14;
      uVar7 = uVar9;
      if (5 < uVar10) {
        if (uVar9 < 0x82) {
          uVar7 = 0x1f;
          uVar12 = (uint)(uVar10 - 2);
          if (uVar12 != 0) {
            for (; uVar12 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          iVar8 = (uVar7 ^ 0xffffffe0) + 0x1f;
          uVar7 = (int)(uVar10 - 2 >> ((byte)iVar8 & 0x3f)) + iVar8 * 2 + 2;
        }
        else if (uVar9 < 0x842) {
          uVar7 = 0x1f;
          if (uVar9 - 0x42 != 0) {
            for (; uVar9 - 0x42 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar7 = (uVar7 ^ 0xffffffe0) + 0x2a;
        }
        else {
          uVar7 = 0x15;
          if (0x1841 < uVar9) {
            uVar7 = 0x17 - (uVar9 < 0x5842);
          }
        }
      }
      bVar1 = (byte)(uVar4 >> 0x18);
      uVar12 = (int)(char)(bVar1 & 0x80 | bVar1 >> 1) + (uVar4 & 0x1ffffff);
      if (uVar12 < 10) {
        uVar13 = uVar12 + 0xfffe;
      }
      else if (uVar12 < 0x86) {
        uVar13 = 0x1f;
        uVar11 = (uint)((ulong)uVar12 - 6);
        if (uVar11 != 0) {
          for (; uVar11 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        iVar8 = (uVar13 ^ 0xffffffe0) + 0x1f;
        uVar13 = (int)((ulong)uVar12 - 6 >> ((byte)iVar8 & 0x3f)) + iVar8 * 2 + 4;
      }
      else {
        uVar13 = 0x17;
        if (uVar12 < 0x846) {
          uVar13 = 0x1f;
          if (uVar12 - 0x46 != 0) {
            for (; uVar12 - 0x46 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = (uVar13 ^ 0xffffffe0) + 0x2c;
        }
      }
      uVar7 = (uVar7 & 0xffff) << 2;
      iVar8 = *(int *)(duckdb_brotli::kBrotliInsExtra + uVar7);
      uVar13 = (uVar13 & 0xffff) << 2;
      iVar6 = *(int *)(duckdb_brotli::kBrotliCopyExtra + uVar13);
      *(ulong *)(storage + (uVar14 >> 3)) =
           ((ulong)(uVar12 - *(int *)(duckdb_brotli::kBrotliCopyBase + uVar13)) <<
            ((byte)iVar8 & 0x3f) | (ulong)(uVar9 - *(int *)(duckdb_brotli::kBrotliInsBase + uVar7)))
           << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
      uVar14 = (uint)(iVar8 + iVar6) + uVar14;
      *storage_ix = uVar14;
      for (; uVar10 != 0; uVar10 = uVar10 - 1) {
        bVar1 = lit_depth[input[start_pos & mask]];
        *(ulong *)(storage + (uVar14 >> 3)) =
             (ulong)lit_bits[input[start_pos & mask]] << ((byte)uVar14 & 7) |
             (ulong)storage[uVar14 >> 3];
        uVar14 = uVar14 + bVar1;
        *storage_ix = uVar14;
        start_pos = start_pos + 1;
      }
      if (((uVar4 & 0x1ffffff) != 0) && (0x7f < uVar2)) {
        uVar9 = uVar3 & 0x3ff;
        uVar10 = dist_depth[uVar9] + uVar14;
        *(ulong *)(storage + (uVar14 >> 3)) =
             (ulong)dist_bits[uVar9] << ((byte)uVar14 & 7) | (ulong)storage[uVar14 >> 3];
        *storage_ix = uVar10;
        *(ulong *)(storage + (uVar10 >> 3)) =
             (ulong)uVar5 << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
        uVar14 = uVar10 + (uVar3 >> 10);
        *storage_ix = uVar14;
      }
      start_pos = start_pos + (uVar4 & 0x1ffffff);
      sVar15 = sVar15 + 1;
    } while (sVar15 != n_commands);
  }
  return;
}

Assistant:

static void StoreDataWithHuffmanCodes(const uint8_t* input,
                                      size_t start_pos,
                                      size_t mask,
                                      const Command* commands,
                                      size_t n_commands,
                                      const uint8_t* lit_depth,
                                      const uint16_t* lit_bits,
                                      const uint8_t* cmd_depth,
                                      const uint16_t* cmd_bits,
                                      const uint8_t* dist_depth,
                                      const uint16_t* dist_bits,
                                      size_t* storage_ix,
                                      uint8_t* storage) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    size_t j;
    BrotliWriteBits(
        cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    for (j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      BrotliWriteBits(
          lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_ & 0x3FF;
      const uint32_t distnumextra = cmd.dist_prefix_ >> 10;
      const uint32_t distextra = cmd.dist_extra_;
      BrotliWriteBits(dist_depth[dist_code], dist_bits[dist_code],
                      storage_ix, storage);
      BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}